

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O0

void __thiscall
llvm::
format_provider<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::format(format_provider<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *V,
        raw_ostream *Stream,StringRef Style)

{
  bool bVar1;
  type_conflict1 tVar2;
  StringRef Str;
  undefined1 local_40 [8];
  StringRef S;
  size_t N;
  raw_ostream *Stream_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *V_local;
  StringRef Style_local;
  
  Style_local.Data = Style.Data;
  S.Length = 0xffffffffffffffff;
  V_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Stream;
  bVar1 = StringRef::empty((StringRef *)&V_local);
  if ((!bVar1) &&
     (tVar2 = StringRef::getAsInteger<unsigned_long>((StringRef *)&V_local,10,&S.Length), tVar2)) {
    __assert_fail("false && \"Style is not a valid integer\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                  ,0xcd,
                  "static void llvm::format_provider<std::basic_string<char>>::format(const T &, llvm::raw_ostream &, StringRef) [T = std::basic_string<char>, Enable = void]"
                 );
  }
  StringRef::StringRef((StringRef *)local_40,(string *)this);
  Str = StringRef::substr((StringRef *)local_40,0,S.Length);
  raw_ostream::operator<<((raw_ostream *)V,Str);
  return;
}

Assistant:

static void format(const T &V, llvm::raw_ostream &Stream, StringRef Style) {
    size_t N = StringRef::npos;
    if (!Style.empty() && Style.getAsInteger(10, N)) {
      assert(false && "Style is not a valid integer");
    }
    llvm::StringRef S = V;
    Stream << S.substr(0, N);
  }